

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fop_test.cc
# Opt level: O0

void __thiscall
IntegrationTest_TestFop_Test::~IntegrationTest_TestFop_Test(IntegrationTest_TestFop_Test *this)

{
  IntegrationTest_TestFop_Test *this_local;
  
  ~IntegrationTest_TestFop_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(IntegrationTest, TestFop)
{
	Qiniu_Client client;

	Qiniu_Client_InitMacAuth(&client, 1024, NULL);
	Qiniu_Client_SetTimeout(&client, 5000);
	Qiniu_Client_SetConnectTimeout(&client, 3000);
	Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

	pfop(&client);

	Qiniu_Client_Cleanup(&client);
}